

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

path * __thiscall CLI::to_path_abi_cxx11_(path *__return_storage_ptr__,CLI *this,string_view str)

{
  string_view str_local;
  
  str_local._M_str = (char *)str._M_len;
  str_local._M_len = (size_t)this;
  ::std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (__return_storage_ptr__,&str_local,auto_format);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::filesystem::path to_path(std::string_view str) {
    return std::filesystem::path{
#ifdef _WIN32
        widen(str)
#else
        str
#endif  // _WIN32
    }